

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O3

void decApplyRound(decNumber *dn,decContext *set,int32_t residue,uint32_t *status)

{
  uint8_t *puVar1;
  byte bVar2;
  int iVar3;
  uint8_t *puVar4;
  int32_t m;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  uint alength;
  
  if (residue == 0) {
    return;
  }
  switch(set->round) {
  case DEC_ROUND_CEILING:
    if ((char)dn->bits < '\0') goto switchD_002557e6_caseD_5;
  case DEC_ROUND_UP:
switchD_002557e6_caseD_1:
    if (residue < 1) {
      return;
    }
    break;
  case DEC_ROUND_HALF_UP:
    if (residue < 5) {
      return;
    }
    break;
  case DEC_ROUND_HALF_EVEN:
    if (residue < 6) {
      if (residue != 5) {
        return;
      }
      if ((dn->lsu[0] & 1) == 0) {
        return;
      }
    }
    break;
  case DEC_ROUND_HALF_DOWN:
    if (residue < 6) {
      return;
    }
    break;
  case DEC_ROUND_DOWN:
switchD_002557e6_caseD_5:
    if (-1 < residue) {
      return;
    }
LAB_00255928:
    alength = dn->digits;
    puVar1 = dn->lsu;
    uVar5 = 9;
    puVar4 = puVar1;
    uVar6 = alength;
    if (1 < alength) {
      puVar4 = dn->lsu + (ulong)(alength - 2) + 1;
      uVar5 = (ulong)(alength - 2) + 10;
      lVar7 = 0;
      do {
        if (puVar1[lVar7] != '\0') {
          m = -1;
          goto LAB_002559f0;
        }
        lVar7 = lVar7 + 1;
      } while (alength - 1 != (int)lVar7);
      uVar6 = 1;
    }
    bVar2 = *puVar4;
    m = -1;
    if (DECPOWERS[uVar6 - 1] == (uint)bVar2) {
      *puVar4 = (char)DECPOWERS[uVar6] - 1;
      if (9 < uVar5) {
        memset(puVar1,9,uVar5 - 9);
      }
      iVar3 = dn->exponent;
      dn->exponent = iVar3 + -1;
      if (iVar3 != (set->emin - set->digits) + 1) {
        return;
      }
      if (alength == 1 && uVar6 != 0) {
        *puVar4 = 0;
      }
      else {
        *puVar4 = bVar2 - 1;
        dn->digits = alength - 1;
      }
      dn->exponent = iVar3;
      *status = *status | 0x3820;
      return;
    }
    goto LAB_002559f0;
  case DEC_ROUND_FLOOR:
    if (-1 < (char)dn->bits) goto switchD_002557e6_caseD_5;
    goto switchD_002557e6_caseD_1;
  case DEC_ROUND_05UP:
    bVar2 = dn->lsu[0];
    if (residue < 0 && bVar2 % 5 != 1) goto LAB_00255928;
    if (residue < 1 || bVar2 != (byte)((bVar2 / 5) * '\x05')) {
      return;
    }
    break;
  default:
    *(byte *)status = (byte)*status | 0x40;
    return;
  }
  alength = dn->digits;
  puVar1 = dn->lsu;
  uVar5 = 9;
  puVar4 = puVar1;
  uVar6 = alength;
  if (1 < alength) {
    puVar4 = dn->lsu + (ulong)(alength - 2) + 1;
    uVar5 = (ulong)(alength - 2) + 10;
    lVar7 = 0;
    do {
      if (puVar1[lVar7] != '\t') {
        m = 1;
        goto LAB_002559f0;
      }
      lVar7 = lVar7 + 1;
    } while (alength - 1 != (int)lVar7);
    uVar6 = 1;
  }
  m = 1;
  if (DECPOWERS[uVar6] - 1 == (uint)*puVar4) {
    *puVar4 = (byte)DECPOWERS[uVar6 - 1];
    if (9 < uVar5) {
      memset(puVar1,0,uVar5 - 9);
    }
    iVar3 = dn->exponent;
    dn->exponent = iVar3 + 1;
    if (set->emax + 1 < (int)(iVar3 + alength + 1)) {
      decSetOverflow(dn,set,status);
      return;
    }
  }
  else {
LAB_002559f0:
    if ((int)alength < 0x32) {
      alength = (uint)""[(int)alength];
    }
    decUnitAddSub(dn->lsu,alength,"\x01",1,0,dn->lsu,m);
  }
  return;
}

Assistant:

static void decApplyRound(decNumber *dn, decContext *set, Int residue,
                          uInt *status) {
  Int  bump;                  /* 1 if coefficient needs to be incremented  */
                              /* -1 if coefficient needs to be decremented  */

  if (residue==0) return;     /* nothing to apply  */

  bump=0;                     /* assume a smooth ride  */

  /* now decide whether, and how, to round, depending on mode  */
  switch (set->round) {
    case DEC_ROUND_05UP: {    /* round zero or five up (for reround)  */
      /* This is the same as DEC_ROUND_DOWN unless there is a  */
      /* positive residue and the lsd of dn is 0 or 5, in which case  */
      /* it is bumped; when residue is <0, the number is therefore  */
      /* bumped down unless the final digit was 1 or 6 (in which  */
      /* case it is bumped down and then up -- a no-op)  */
      Int lsd5=*dn->lsu%5;     /* get lsd and quintate  */
      if (residue<0 && lsd5!=1) bump=-1;
       else if (residue>0 && lsd5==0) bump=1;
      /* [bump==1 could be applied directly; use common path for clarity]  */
      break;} /* r-05  */

    case DEC_ROUND_DOWN: {
      /* no change, except if negative residue  */
      if (residue<0) bump=-1;
      break;} /* r-d  */

    case DEC_ROUND_HALF_DOWN: {
      if (residue>5) bump=1;
      break;} /* r-h-d  */

    case DEC_ROUND_HALF_EVEN: {
      if (residue>5) bump=1;            /* >0.5 goes up  */
       else if (residue==5) {           /* exactly 0.5000...  */
        /* 0.5 goes up iff [new] lsd is odd  */
        if (*dn->lsu & 0x01) bump=1;
        }
      break;} /* r-h-e  */

    case DEC_ROUND_HALF_UP: {
      if (residue>=5) bump=1;
      break;} /* r-h-u  */

    case DEC_ROUND_UP: {
      if (residue>0) bump=1;
      break;} /* r-u  */

    case DEC_ROUND_CEILING: {
      /* same as _UP for positive numbers, and as _DOWN for negatives  */
      /* [negative residue cannot occur on 0]  */
      if (decNumberIsNegative(dn)) {
        if (residue<0) bump=-1;
        }
       else {
        if (residue>0) bump=1;
        }
      break;} /* r-c  */

    case DEC_ROUND_FLOOR: {
      /* same as _UP for negative numbers, and as _DOWN for positive  */
      /* [negative residue cannot occur on 0]  */
      if (!decNumberIsNegative(dn)) {
        if (residue<0) bump=-1;
        }
       else {
        if (residue>0) bump=1;
        }
      break;} /* r-f  */

    default: {      /* e.g., DEC_ROUND_MAX  */
      *status|=DEC_Invalid_context;
      #if DECTRACE || (DECCHECK && DECVERB)
      printf("Unknown rounding mode: %d\n", set->round);
      #endif
      break;}
    } /* switch  */

  /* now bump the number, up or down, if need be  */
  if (bump==0) return;                       /* no action required  */

  /* Simply use decUnitAddSub unless bumping up and the number is  */
  /* all nines.  In this special case set to 100... explicitly  */
  /* and adjust the exponent by one (as otherwise could overflow  */
  /* the array)  */
  /* Similarly handle all-nines result if bumping down.  */
  if (bump>0) {
    Unit *up;                                /* work  */
    uInt count=dn->digits;                   /* digits to be checked  */
    for (up=dn->lsu; ; up++) {
      if (count<=DECDPUN) {
        /* this is the last Unit (the msu)  */
        if (*up!=powers[count]-1) break;     /* not still 9s  */
        /* here if it, too, is all nines  */
        *up=(Unit)powers[count-1];           /* here 999 -> 100 etc.  */
        for (up=up-1; up>=dn->lsu; up--) *up=0; /* others all to 0  */
        dn->exponent++;                      /* and bump exponent  */
        /* [which, very rarely, could cause Overflow...]  */
        if ((dn->exponent+dn->digits)>set->emax+1) {
          decSetOverflow(dn, set, status);
          }
        return;                              /* done  */
        }
      /* a full unit to check, with more to come  */
      if (*up!=DECDPUNMAX) break;            /* not still 9s  */
      count-=DECDPUN;
      } /* up  */
    } /* bump>0  */
   else {                                    /* -1  */
    /* here checking for a pre-bump of 1000... (leading 1, all  */
    /* other digits zero)  */
    Unit *up, *sup;                          /* work  */
    uInt count=dn->digits;                   /* digits to be checked  */
    for (up=dn->lsu; ; up++) {
      if (count<=DECDPUN) {
        /* this is the last Unit (the msu)  */
        if (*up!=powers[count-1]) break;     /* not 100..  */
        /* here if have the 1000... case  */
        sup=up;                              /* save msu pointer  */
        *up=(Unit)powers[count]-1;           /* here 100 in msu -> 999  */
        /* others all to all-nines, too  */
        for (up=up-1; up>=dn->lsu; up--) *up=(Unit)powers[DECDPUN]-1;
        dn->exponent--;                      /* and bump exponent  */

        /* iff the number was at the subnormal boundary (exponent=etiny)  */
        /* then the exponent is now out of range, so it will in fact get  */
        /* clamped to etiny and the final 9 dropped.  */
        /* printf(">> emin=%d exp=%d sdig=%d\n", set->emin,  */
        /*        dn->exponent, set->digits);  */
        if (dn->exponent+1==set->emin-set->digits+1) {
          if (count==1 && dn->digits==1) *sup=0;  /* here 9 -> 0[.9]  */
           else {
            *sup=(Unit)powers[count-1]-1;    /* here 999.. in msu -> 99..  */
            dn->digits--;
            }
          dn->exponent++;
          *status|=DEC_Underflow | DEC_Subnormal | DEC_Inexact | DEC_Rounded;
          }
        return;                              /* done  */
        }

      /* a full unit to check, with more to come  */
      if (*up!=0) break;                     /* not still 0s  */
      count-=DECDPUN;
      } /* up  */

    } /* bump<0  */

  /* Actual bump needed.  Do it.  */
  decUnitAddSub(dn->lsu, D2U(dn->digits), uarrone, 1, 0, dn->lsu, bump);
  }